

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O0

void SerializeHDKeypaths<DataStream>
               (DataStream *s,
               map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
               *hd_keypaths,CompactSizeWriter type)

{
  bool bVar1;
  char *pcVar2;
  error_code *in_RDI;
  long in_FS_OFFSET;
  pair<const_CPubKey,_KeyOriginInfo> *keypath_pair;
  map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  KeyOriginInfo *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  io_errc in_stack_ffffffffffffff34;
  error_code *in_stack_ffffffffffffff38;
  DataStream *s_00;
  KeyOriginInfo *in_stack_ffffffffffffff60;
  char *pcVar3;
  DataStream *in_stack_ffffffffffffff68;
  DataStream local_60;
  _Base_ptr local_40;
  _Base_ptr local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (_Base_ptr)
             std::
             map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
             ::begin((map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  local_40 = (_Base_ptr)
             std::
             map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
             ::end((map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  do {
    bVar1 = std::operator==((_Self *)in_stack_ffffffffffffff38,
                            (_Self *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
LAB_00e0ba3d:
      __stack_chk_fail();
    }
    std::_Rb_tree_const_iterator<std::pair<const_CPubKey,_KeyOriginInfo>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_CPubKey,_KeyOriginInfo>_> *)
               in_stack_ffffffffffffff28);
    bVar1 = CPubKey::IsValid((CPubKey *)in_stack_ffffffffffffff28);
    if (!bVar1) {
      pcVar2 = (char *)__cxa_allocate_exception(0x20);
      pcVar3 = pcVar2;
      std::error_code::error_code<std::io_errc,void>
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar3,(error_code *)"Invalid CPubKey being serialized");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_00e0ba3d;
    }
    s_00 = &local_60;
    in_stack_ffffffffffffff38 = in_RDI;
    Span<const_unsigned_char>::Span<CPubKey>
              ((Span<const_unsigned_char> *)in_RDI,
               (CPubKey *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
              (s_00,(CompactSizeWriter *)in_stack_ffffffffffffff38,
               (Span<const_unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    KeyOriginInfo::KeyOriginInfo(in_stack_ffffffffffffff28,(KeyOriginInfo *)0xe0b9a4);
    SerializeHDKeypath<DataStream>(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    KeyOriginInfo::~KeyOriginInfo(in_stack_ffffffffffffff28);
    std::_Rb_tree_const_iterator<std::pair<const_CPubKey,_KeyOriginInfo>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_CPubKey,_KeyOriginInfo>_> *)
               in_stack_ffffffffffffff28);
  } while( true );
}

Assistant:

void SerializeHDKeypaths(Stream& s, const std::map<CPubKey, KeyOriginInfo>& hd_keypaths, CompactSizeWriter type)
{
    for (const auto& keypath_pair : hd_keypaths) {
        if (!keypath_pair.first.IsValid()) {
            throw std::ios_base::failure("Invalid CPubKey being serialized");
        }
        SerializeToVector(s, type, Span{keypath_pair.first});
        SerializeHDKeypath(s, keypath_pair.second);
    }
}